

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O1

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  bool bVar4;
  sunrealtype sVar5;
  double __x;
  double __x_00;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  int local_84;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    arkProcessError(ark_mem,-0x15,0x869,"lsrkStep_TakeStepSSPs3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"Time step module memory is NULL.");
    iVar7 = -0x15;
  }
  else {
    pauVar2 = (undefined1 (*) [16])puVar1[0x12];
    puVar3 = (undefined8 *)puVar1[0x13];
    __x = (double)*(int *)(puVar1 + 3);
    if (*(int *)(puVar1 + 3) < 1) {
      __x_00 = 0.0;
    }
    else if (__x < 0.0) {
      __x_00 = sqrt(__x);
    }
    else {
      __x_00 = SQRT(__x);
    }
    dVar6 = round(__x_00);
    if (ark_mem->fn_is_current == 0) {
      iVar7 = (*(code *)*puVar1)(SUB84(ark_mem->tn,0),ark_mem->yn,ark_mem->fn,ark_mem->user_data);
      puVar1[4] = puVar1[4] + 1;
      if (iVar7 != 0) {
        return -8;
      }
      ark_mem->fn_is_current = 1;
    }
    dVar15 = 1.0 / (__x - __x_00);
    N_VLinearSum(0,ark_mem->h * dVar15,ark_mem->yn,ark_mem->fn,ark_mem->ycur);
    if (ark_mem->fixedstep == 0) {
      N_VLinearSum(0,ark_mem->h / __x,ark_mem->yn,ark_mem->fn,ark_mem->tempv1);
    }
    if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
       (iVar7 = (*ark_mem->ProcessStage)
                          (ark_mem->h * dVar15 + ark_mem->tn,ark_mem->ycur,ark_mem->user_data),
       iVar7 != 0)) {
      return -0x26;
    }
    iVar10 = (int)dVar6;
    iVar7 = (iVar10 + -2) * (iVar10 + -1);
    iVar11 = iVar7 / 2;
    bVar4 = iVar7 < 4;
    if (3 < iVar7) {
      iVar7 = 2;
      iVar9 = 2;
      if (2 < iVar11) {
        iVar9 = iVar11;
      }
      do {
        iVar8 = (*(code *)*puVar1)(SUB84((double)(iVar7 + -1) * dVar15 * ark_mem->h + ark_mem->tcur,
                                         0),ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
        puVar1[4] = puVar1[4] + 1;
        if (iVar8 < 0) {
          local_84 = -8;
          break;
        }
        if (iVar8 != 0) {
          local_84 = 9;
          break;
        }
        N_VLinearSum(0,ark_mem->h * dVar15,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
        if (ark_mem->fixedstep == 0) {
          N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
        }
        if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
           (iVar8 = (*ark_mem->ProcessStage)
                              ((double)iVar7 * dVar15 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                               ark_mem->user_data), iVar8 != 0)) {
          local_84 = -0x26;
          break;
        }
        bVar4 = iVar11 <= iVar7;
        bVar12 = iVar7 != iVar9;
        iVar7 = iVar7 + 1;
      } while (bVar12);
    }
    iVar7 = local_84;
    if (bVar4) {
      N_VScale(0,ark_mem->ycur,ark_mem->tempv2);
      iVar10 = ((iVar10 + 1) * iVar10) / 2;
      iVar7 = iVar10 + -1;
      bVar4 = iVar11 < iVar7;
      if (iVar11 < iVar7) {
        do {
          dVar6 = (double)iVar11;
          iVar11 = iVar11 + 1;
          iVar9 = (*(code *)*puVar1)(SUB84(dVar6 * dVar15 * ark_mem->h + ark_mem->tcur,0),
                                     ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
          puVar1[4] = puVar1[4] + 1;
          if (iVar9 < 0) {
            local_84 = -8;
            break;
          }
          if (iVar9 != 0) {
            local_84 = 9;
            break;
          }
          N_VLinearSum(0,ark_mem->h * dVar15,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
          if (ark_mem->fixedstep == 0) {
            N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
          }
          if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
             (iVar9 = (*ark_mem->ProcessStage)
                                ((double)iVar11 * dVar15 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                                 ark_mem->user_data), iVar9 != 0)) {
            local_84 = -0x26;
            break;
          }
          bVar4 = iVar11 < iVar7;
        } while (iVar11 != iVar7);
      }
      iVar7 = local_84;
      if (!bVar4) {
        iVar11 = (*(code *)*puVar1)(SUB84(((__x_00 + 1.0) * __x_00 * 0.5 + -1.0) * dVar15 *
                                          ark_mem->h + ark_mem->tcur,0),ark_mem->ycur,
                                    ark_mem->tempv3,ark_mem->user_data);
        puVar1[4] = puVar1[4] + 1;
        if (iVar11 < 0) {
          iVar7 = -8;
        }
        else {
          iVar7 = 9;
          if (iVar11 == 0) {
            dVar16 = __x_00 + -1.0;
            dVar6 = __x_00 + __x_00 + -1.0;
            *puVar3 = ark_mem->ycur;
            auVar13._8_8_ = __x_00;
            auVar13._0_8_ = dVar16;
            auVar14._8_8_ = dVar6;
            auVar14._0_8_ = dVar6;
            auVar14 = divpd(auVar13,auVar14);
            *pauVar2 = auVar14;
            puVar3[1] = ark_mem->tempv2;
            *(double *)pauVar2[1] = (dVar16 * dVar15 * ark_mem->h) / dVar6;
            puVar3[2] = ark_mem->tempv3;
            iVar11 = N_VLinearCombination(3,pauVar2,puVar3,ark_mem->ycur);
            iVar7 = -0x1c;
            if (iVar11 == 0) {
              if (ark_mem->fixedstep == 0) {
                N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
              }
              if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
                 (iVar7 = (*ark_mem->ProcessStage)
                                    (dVar16 * __x_00 * 0.5 * dVar15 * ark_mem->h + ark_mem->tcur,
                                     ark_mem->ycur,ark_mem->user_data), iVar7 != 0)) {
                return -0x26;
              }
              do {
                bVar4 = *(int *)(puVar1 + 3) <= iVar10;
                if (*(int *)(puVar1 + 3) <= iVar10) goto LAB_0014b6c4;
                iVar10 = iVar10 + 1;
                iVar7 = (*(code *)*puVar1)(SUB84((((double)iVar10 - __x_00) + -1.0) * dVar15 *
                                                 ark_mem->h + ark_mem->tcur,0),ark_mem->ycur,
                                           ark_mem->tempv3,ark_mem->user_data);
                puVar1[4] = puVar1[4] + 1;
                if (iVar7 < 0) {
                  local_84 = -8;
                  goto LAB_0014b6c4;
                }
                if (iVar7 != 0) {
                  local_84 = 9;
                  goto LAB_0014b6c4;
                }
                N_VLinearSum(0,ark_mem->h * dVar15,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
                if (ark_mem->fixedstep == 0) {
                  N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
                }
              } while (((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
                       (*(int *)(puVar1 + 3) <= iVar10)) ||
                      (iVar7 = (*ark_mem->ProcessStage)
                                         (((double)iVar10 - __x_00) * dVar15 * ark_mem->h +
                                          ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
                      iVar7 == 0));
              local_84 = -0x26;
LAB_0014b6c4:
              iVar7 = local_84;
              if (bVar4) {
                iVar7 = 0;
                if (ark_mem->fixedstep == 0) {
                  N_VLinearSum(0,0xbff0000000000000,ark_mem->ycur,ark_mem->tempv1);
                  sVar5 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
                  *dsmPtr = sVar5;
                  iVar7 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs  = (sunrealtype)step_mem->req_stages;
  sunrealtype rn  = SUNRsqrt(rs);
  sunrealtype rat = ONE / (rs - rn);
  int in          = (int)SUNRround(rn);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + rat * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * rat, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * rat,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= ((in - 1) * (in - 2) / 2); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

  for (int j = ((in - 1) * (in - 2) / 2 + 1); j <= (in * (in + 1) / 2 - 1); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  retval = step_mem->fe(ark_mem->tcur +
                          rat * (rn * (rn + ONE) / TWO - ONE) * ark_mem->h,
                        ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                      "F_%i(:) =", in * (in + 1) / 2 - 1);
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             (in * (in + 1) / 2),
             ark_mem->tn + (in * (in - 1) / 2) * rat * ark_mem->h);

  cvals[0] = (rn - ONE) / (TWO * rn - ONE);
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = rn / (TWO * rn - ONE);
  Xvecs[1] = ark_mem->tempv2;
  cvals[2] = (rn - ONE) * rat * ark_mem->h / (TWO * rn - ONE);
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur +
                                     rat * (rn * (rn - ONE) / TWO) * ark_mem->h,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0) { return ARK_POSTPROCESS_STAGE_FAIL; }
  }

  for (int j = (in * (in + 1) / 2 + 1); j <= step_mem->req_stages; j++)
  {
    retval = step_mem->fe(ark_mem->tcur +
                            ((sunrealtype)j - rn - ONE) * rat * ark_mem->h,
                          ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ((sunrealtype)j - rn) * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur +
                                       ((sunrealtype)j - rn) * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");
    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}